

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O3

uint __thiscall Potassco::ProgramReader::matchPos(ProgramReader *this,uint max,char *err)

{
  bool bVar1;
  uint line;
  BufferedStream *this_00;
  int64_t x;
  ulong local_20;
  
  this_00 = stream(this);
  bVar1 = BufferedStream::match(this_00,(int64_t *)&local_20,false);
  if (((!bVar1) || ((long)local_20 < 0)) || (max < local_20)) {
    line = BufferedStream::line(this_00);
    BufferedStream::fail(line,err);
  }
  return (uint)local_20;
}

Assistant:

unsigned matchPos(unsigned max = static_cast<unsigned>(-1), const char* err = "unsigned integer expected") { return Potassco::matchPos(*stream(), max, err); }